

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

int xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt,xmlDocPtr instance)

{
  xmlSchematronPatternPtr_conflict pattern;
  int iVar1;
  xmlNodePtr cur;
  xmlNodePtr cur_00;
  xmlSchematronTestPtr_conflict pxVar2;
  xmlSchematronRulePtr_conflict pxVar3;
  char msg [1000];
  char local_418 [1000];
  
  iVar1 = -1;
  if ((((ctxt != (xmlSchematronValidCtxtPtr)0x0) && (ctxt->schema != (xmlSchematronPtr)0x0)) &&
      (instance != (xmlDocPtr)0x0)) && (ctxt->schema->rules != (xmlSchematronRulePtr_conflict)0x0))
  {
    ctxt->nberrors = 0;
    cur = xmlDocGetRootElement(instance);
    if (cur == (xmlNodePtr)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
      iVar1 = 1;
    }
    else {
      if (ctxt->flags == 0 || (ctxt->flags & 1U) != 0) {
        do {
          for (pxVar3 = ctxt->schema->rules; pxVar3 != (xmlSchematronRulePtr_conflict)0x0;
              pxVar3 = pxVar3->next) {
            iVar1 = xmlPatternMatch(pxVar3->pattern,cur);
            if (iVar1 == 1) {
              pxVar2 = pxVar3->tests;
              iVar1 = xmlSchematronRegisterVariables(ctxt,ctxt->xctxt,pxVar3->lets,instance,cur);
              if (iVar1 != 0) {
                return -1;
              }
              for (; pxVar2 != (xmlSchematronTestPtr_conflict)0x0; pxVar2 = pxVar2->next) {
                xmlSchematronRunTest
                          (ctxt,pxVar2,instance,cur,
                           (xmlSchematronPatternPtr_conflict)pxVar3->pattern);
              }
              iVar1 = xmlSchematronUnregisterVariables(ctxt,ctxt->xctxt,pxVar3->lets);
              if (iVar1 != 0) {
                return -1;
              }
            }
          }
          cur = xmlSchematronNextNode(cur);
        } while (cur != (xmlNodePtr)0x0);
      }
      else {
        for (pattern = ctxt->schema->patterns; pattern != (xmlSchematronPatternPtr_conflict)0x0;
            pattern = pattern->next) {
          cur_00 = cur;
          if (((ctxt->flags & 0xd) == 0) && (pattern->name != (xmlChar *)0x0)) {
            snprintf(local_418,999,"Pattern: %s\n");
            xmlPrintErrorMessage("%s",local_418);
          }
          do {
            for (pxVar3 = pattern->rules; pxVar3 != (xmlSchematronRulePtr_conflict)0x0;
                pxVar3 = pxVar3->patnext) {
              iVar1 = xmlPatternMatch(pxVar3->pattern,cur_00);
              if (iVar1 == 1) {
                pxVar2 = pxVar3->tests;
                xmlSchematronRegisterVariables(ctxt,ctxt->xctxt,pxVar3->lets,instance,cur_00);
                for (; pxVar2 != (xmlSchematronTestPtr_conflict)0x0; pxVar2 = pxVar2->next) {
                  xmlSchematronRunTest(ctxt,pxVar2,instance,cur_00,pattern);
                }
                xmlSchematronUnregisterVariables(ctxt,ctxt->xctxt,pxVar3->lets);
              }
            }
            cur_00 = xmlSchematronNextNode(cur_00);
          } while (cur_00 != (xmlNodePtr)0x0);
        }
      }
      iVar1 = ctxt->nberrors;
    }
  }
  return iVar1;
}

Assistant:

int
xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt, xmlDocPtr instance)
{
    xmlNodePtr cur, root;
    xmlSchematronPatternPtr pattern;
    xmlSchematronRulePtr rule;
    xmlSchematronTestPtr test;

    if ((ctxt == NULL) || (ctxt->schema == NULL) ||
        (ctxt->schema->rules == NULL) || (instance == NULL))
        return(-1);
    ctxt->nberrors = 0;
    root = xmlDocGetRootElement(instance);
    if (root == NULL) {
        /* TODO */
        ctxt->nberrors++;
        return(1);
    }
    if ((ctxt->flags & XML_SCHEMATRON_OUT_QUIET) ||
        (ctxt->flags == 0)) {
        /*
         * we are just trying to assert the validity of the document,
         * speed primes over the output, run in a single pass
         */
        cur = root;
        while (cur != NULL) {
            rule = ctxt->schema->rules;
            while (rule != NULL) {
                if (xmlPatternMatch(rule->pattern, cur) == 1) {
                    test = rule->tests;

                    if (xmlSchematronRegisterVariables(ctxt, ctxt->xctxt,
                                rule->lets, instance, cur))
                        return -1;

                    while (test != NULL) {
                        xmlSchematronRunTest(ctxt, test, instance, cur, (xmlSchematronPatternPtr)rule->pattern);
                        test = test->next;
                    }

                    if (xmlSchematronUnregisterVariables(ctxt, ctxt->xctxt,
                                rule->lets))
                        return -1;

                }
                rule = rule->next;
            }

            cur = xmlSchematronNextNode(cur);
        }
    } else {
        /*
         * Process all contexts one at a time
         */
        pattern = ctxt->schema->patterns;

        while (pattern != NULL) {
            xmlSchematronReportPattern(ctxt, pattern);

            /*
             * TODO convert the pattern rule to a direct XPath and
             * compute directly instead of using the pattern matching
             * over the full document...
             * Check the exact semantic
             */
            cur = root;
            while (cur != NULL) {
                rule = pattern->rules;
                while (rule != NULL) {
                    if (xmlPatternMatch(rule->pattern, cur) == 1) {
                        test = rule->tests;
                        xmlSchematronRegisterVariables(ctxt, ctxt->xctxt,
                                rule->lets, instance, cur);

                        while (test != NULL) {
                            xmlSchematronRunTest(ctxt, test, instance, cur, pattern);
                            test = test->next;
                        }

                        xmlSchematronUnregisterVariables(ctxt, ctxt->xctxt,
                                rule->lets);
                    }
                    rule = rule->patnext;
                }

                cur = xmlSchematronNextNode(cur);
            }
            pattern = pattern->next;
        }
    }
    return(ctxt->nberrors);
}